

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::SetInnerRML(Element *this,String *rml)

{
  size_type sVar1;
  reference this_00;
  ulong uVar2;
  undefined1 local_20 [16];
  String *rml_local;
  Element *this_local;
  
  local_20._8_8_ = rml;
  rml_local = (String *)this;
  while( true ) {
    sVar1 = ::std::
            vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
            ::size(&this->children);
    if ((int)sVar1 <= this->num_non_dom_children) break;
    this_00 = ::std::
              vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
              ::front(&this->children);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::get(this_00);
    RemoveChild((Element *)local_20,this);
    ::std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>::~unique_ptr
              ((unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_> *)local_20);
  }
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    Factory::InstanceElementText(this,(String *)local_20._8_8_);
  }
  return;
}

Assistant:

void Element::SetInnerRML(const String& rml)
{
	RMLUI_ZoneScopedC(0x6495ED);

	// Remove all DOM children.
	while ((int)children.size() > num_non_dom_children)
		RemoveChild(children.front().get());

	if (!rml.empty())
		Factory::InstanceElementText(this, rml);
}